

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapper_2.cpp
# Opt level: O1

pair<int,_unsigned_short> __thiscall
n_e_s::core::Mapper2::translate_nametable_addr(Mapper2 *this,uint16_t addr,Mirroring m)

{
  runtime_error *this_00;
  uint __val;
  bool bVar1;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __val = addr & 0xfff;
  if (m == Horizontal) {
    if (__val < 0x400) goto LAB_001d3e11;
    bVar1 = __val < 0x800;
LAB_001d3e21:
    bVar1 = !bVar1;
  }
  else {
    if (((this->super_IRom).header_.flags_6 & 1) == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&sStack_58,__val);
      std::operator+(&local_38,"Unknown address: ",&sStack_58);
      std::runtime_error::runtime_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (__val < 0x400) {
LAB_001d3e11:
      bVar1 = false;
      goto LAB_001d3e2c;
    }
    if (0x7ff < __val) {
      bVar1 = __val < 0xc00;
      goto LAB_001d3e21;
    }
    bVar1 = true;
  }
  __val = addr & 0x3ff;
LAB_001d3e2c:
  return (pair<int,_unsigned_short>)((ulong)__val << 0x20 | (ulong)bVar1);
}

Assistant:

std::pair<int, uint16_t> Mapper2::translate_nametable_addr(uint16_t addr,
        Mirroring m) const {
    // TODO(johnor): This logic is identical to mapper 0 (Nrom).
    // Refactor and move outside the mapper.

    // Nametables
    // Range        Size    Desc
    // $2000-$23FF  $0400   Nametable 0
    // $2400-$27FF  $0400   Nametable 1
    // $2800-$2BFF  $0400   Nametable 2
    // $2C00-$2FFF  $0400   Nametable 3
    // $3000-$3EFF  $0F00   Mirrors of $2000-$2EFF

    // Ignore top 4 bits to handle mirroring
    addr &= 0x0FFFu;
    if (m == Mirroring::Horizontal) {
        // Nametable 0 and 1 should be the same
        if (addr <= 0x03FF) {
            return {0, addr % 0x0400};
        }
        if (addr >= 0x0400 && addr <= 0x07FF) {
            return {0, addr % 0x0400};
        }
        if (addr >= 0x0800 && addr <= 0x0BFF) {
            return {1, addr % 0x0400};
        }
        if (addr >= 0x0C00 && addr <= 0x0FFF) {
            return {1, addr % 0x0400};
        }
    } else if (header().mirroring() == Mirroring::Vertical) {
        // Nametable 0 and 3 should be the same
        if (addr <= 0x03FF) {
            return {0, addr % 0x0400};
        }
        if (addr >= 0x0400 && addr <= 0x07FF) {
            return {1, addr % 0x0400};
        }
        if (addr >= 0x0800 && addr <= 0x0BFF) {
            return {0, addr % 0x0400};
        }
        if (addr >= 0x0C00 && addr <= 0x0FFF) {
            return {1, addr % 0x0400};
        }
    }
    throw std::runtime_error("Unknown address: " + std::to_string(addr));
}